

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TimingControlExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlExpressionSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,TimingControlSyntax *args,ExpressionSyntax *args_1)

{
  TimingControlExpressionSyntax *pTVar1;
  
  pTVar1 = (TimingControlExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimingControlExpressionSyntax *)this->endPtr < pTVar1 + 1) {
    pTVar1 = (TimingControlExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pTVar1 + 1);
  }
  (pTVar1->super_ExpressionSyntax).super_SyntaxNode.kind = TimingControlExpression;
  (pTVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pTVar1->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pTVar1->timing).ptr = args;
  (pTVar1->expr).ptr = args_1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pTVar1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pTVar1;
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }